

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::save_to_file(CVmObjTads *this,CVmFile *fp)

{
  ushort uVar1;
  vm_val_t *in_RSI;
  CVmFile *in_RDI;
  char slot [16];
  vm_tadsobj_hdr *hdr;
  uint cnt;
  vm_tadsobj_prop *entry;
  size_t i;
  vm_val_t *in_stack_ffffffffffffff98;
  CVmFile *in_stack_ffffffffffffffa0;
  CVmFile *this_00;
  vm_val_t *buf;
  undefined1 local_48 [24];
  vm_tadsobj_hdr *local_30;
  int local_24;
  vm_tadsobj_prop *local_20;
  CVmFile *local_18;
  vm_val_t *local_10;
  
  local_10 = in_RSI;
  local_30 = get_hdr((CVmObjTads *)in_RDI);
  local_24 = 0;
  local_20 = local_30->prop_entry_arr;
  for (local_18 = (CVmFile *)(ulong)local_30->prop_entry_free; local_18 != (CVmFile *)0x0;
      local_18 = (CVmFile *)((long)local_18 - 1)) {
    if ((local_20->flags & 1) != 0) {
      local_24 = local_24 + 1;
    }
    local_20 = local_20 + 1;
  }
  CVmFile::write_uint2(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  buf = local_10;
  get_sc_count((CVmObjTads *)0x3476cc);
  CVmFile::write_uint2(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  local_18 = (CVmFile *)0x0;
  while( true ) {
    this_00 = local_18;
    uVar1 = get_sc_count((CVmObjTads *)0x3476f6);
    if ((CVmFile *)(ulong)uVar1 <= this_00) break;
    in_stack_ffffffffffffff98 = local_10;
    get_sc((CVmObjTads *)this_00,(uint)((ulong)local_10 >> 0x20));
    CVmFile::write_uint4(this_00,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_18 = (CVmFile *)((long)&((CVmObject *)&local_18->fp_)->_vptr_CVmObject + 1);
  }
  local_24 = 0;
  local_20 = local_30->prop_entry_arr;
  for (local_18 = (CVmFile *)(ulong)local_30->prop_entry_free; local_18 != (CVmFile *)0x0;
      local_18 = (CVmFile *)((long)local_18 - 1)) {
    if ((local_20->flags & 1) != 0) {
      ::oswp2(local_48,(uint)local_20->prop);
      vmb_put_dh((char *)this_00,in_stack_ffffffffffffff98);
      CVmFile::write_bytes(in_RDI,(char *)buf,(size_t)this_00);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void CVmObjTads::save_to_file(VMG_ CVmFile *fp)
{
    size_t i;
    vm_tadsobj_prop *entry;
    uint cnt;
    vm_tadsobj_hdr *hdr = get_hdr();

    /* count the number of properties that have actually been modified */
    for (cnt = 0, i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* if the slot is modified, count it */
        if ((entry->flags & VMTO_PROP_MOD) != 0)
            ++cnt;
    }

    /* write the number of modified properties */
    fp->write_uint2(cnt);

    /* write the number of superclasses */
    fp->write_uint2(get_sc_count());

    /* write the superclasses */
    for (i = 0 ; i < get_sc_count() ; ++i)
        fp->write_uint4(get_sc(i));

    /* write each modified property */
    for (cnt = 0, i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* if the slot is modified, write it out */
        if ((entry->flags & VMTO_PROP_MOD) != 0)
        {
            char slot[16];

            /* prepare the slot data */
            oswp2(slot, entry->prop);
            vmb_put_dh(slot + 2, &entry->val);

            /* write the slot */
            fp->write_bytes(slot, 2 + VMB_DATAHOLDER);
        }
    }
}